

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::usub_borrow_invalid_borrow
               (NegativeTestContext *ctx)

{
  ShaderType SVar1;
  NegativeTestContext *pNVar2;
  bool bVar3;
  char *__s;
  undefined1 *in_stack_fffffffffffffe20;
  string local_158;
  undefined1 local_138 [8];
  string shaderSource_2;
  undefined1 local_110 [4];
  int dataTypeNdx2;
  undefined1 local_f0 [8];
  string shaderSource_1;
  undefined1 local_b0 [8];
  string shaderSource;
  int dataTypeNdx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  int local_48;
  int shaderNdx;
  allocator<char> local_31;
  string local_30;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"usubBorrow: Invalid borrow type.",&local_31);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  for (local_48 = 0; local_48 < 6; local_48 = local_48 + 1) {
    bVar3 = NegativeTestContext::isShaderSupported
                      (local_10,*(ShaderType *)
                                 (NegativeTestShared::(anonymous_namespace)::s_shaders +
                                 (long)local_48 * 4));
    pNVar2 = local_10;
    if (bVar3) {
      __s = glu::getShaderTypeName
                      (*(ShaderType *)
                        (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4))
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&dataTypeNdx,__s,
                 (allocator<char> *)(shaderSource.field_2._M_local_buf + 0xf));
      std::operator+(&local_68,"Verify shader: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &dataTypeNdx);
      NegativeTestContext::beginSection(pNVar2,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&dataTypeNdx);
      std::allocator<char>::~allocator((allocator<char> *)(shaderSource.field_2._M_local_buf + 0xf))
      ;
      for (shaderSource.field_2._8_4_ = 0; (int)shaderSource.field_2._8_4_ < 4;
          shaderSource.field_2._8_4_ = shaderSource.field_2._8_4_ + 1) {
        NegativeTestShared::(anonymous_namespace)::genShaderSourceAddCarrySubBorrow_abi_cxx11_
                  ((string *)local_b0,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                   (long)local_48 * 4),SHADERTYPE_COMPUTE,
                   *(ShaderFunction *)
                    (NegativeTestShared::(anonymous_namespace)::s_uintTypes +
                    (long)(int)shaderSource.field_2._8_4_ * 4),
                   *(ShaderFunction *)
                    (NegativeTestShared::(anonymous_namespace)::s_uintTypes +
                    (long)(int)shaderSource.field_2._8_4_ * 4),
                   *(DataType *)
                    (NegativeTestShared::(anonymous_namespace)::s_floatTypes +
                    (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_fffffffffffffe20);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)
                 (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_1.field_2._M_local_buf + 8),(string *)local_b0);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_1.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_1.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_b0);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceAddCarrySubBorrow_abi_cxx11_
                  ((string *)local_f0,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                   (long)local_48 * 4),SHADERTYPE_COMPUTE,
                   *(ShaderFunction *)
                    (NegativeTestShared::(anonymous_namespace)::s_uintTypes +
                    (long)(int)shaderSource.field_2._8_4_ * 4),
                   *(ShaderFunction *)
                    (NegativeTestShared::(anonymous_namespace)::s_uintTypes +
                    (long)(int)shaderSource.field_2._8_4_ * 4),
                   *(DataType *)
                    (NegativeTestShared::(anonymous_namespace)::s_intTypes +
                    (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_fffffffffffffe20);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)
                 (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string((string *)local_110,(string *)local_f0);
        verifyShader(pNVar2,SVar1,(string *)local_110);
        std::__cxx11::string::~string((string *)local_110);
        std::__cxx11::string::~string((string *)local_f0);
        for (shaderSource_2.field_2._12_4_ = 0; (int)shaderSource_2.field_2._12_4_ < 4;
            shaderSource_2.field_2._12_4_ = shaderSource_2.field_2._12_4_ + 1) {
          if (*(int *)(NegativeTestShared::(anonymous_namespace)::s_uintTypes +
                      (long)(int)shaderSource_2.field_2._12_4_ * 4) !=
              *(int *)(NegativeTestShared::(anonymous_namespace)::s_uintTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4)) {
            in_stack_fffffffffffffe20 = NegativeTestShared::(anonymous_namespace)::s_shaders;
            NegativeTestShared::(anonymous_namespace)::genShaderSourceAddCarrySubBorrow_abi_cxx11_
                      ((string *)local_138,(_anonymous_namespace_ *)local_10,
                       (NegativeTestContext *)
                       (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                       (long)local_48 * 4),SHADERTYPE_COMPUTE,
                       *(ShaderFunction *)
                        (NegativeTestShared::(anonymous_namespace)::s_uintTypes +
                        (long)(int)shaderSource.field_2._8_4_ * 4),
                       *(ShaderFunction *)
                        (NegativeTestShared::(anonymous_namespace)::s_uintTypes +
                        (long)(int)shaderSource.field_2._8_4_ * 4),
                       *(DataType *)
                        (NegativeTestShared::(anonymous_namespace)::s_uintTypes +
                        (long)(int)shaderSource_2.field_2._12_4_ * 4),0x2c34be0);
            pNVar2 = local_10;
            SVar1 = *(ShaderType *)(in_stack_fffffffffffffe20 + (long)local_48 * 4);
            std::__cxx11::string::string((string *)&local_158,(string *)local_138);
            verifyShader(pNVar2,SVar1,&local_158);
            std::__cxx11::string::~string((string *)&local_158);
            std::__cxx11::string::~string((string *)local_138);
          }
        }
      }
      NegativeTestContext::endSection(local_10);
    }
  }
  NegativeTestContext::endSection(local_10);
  return;
}

Assistant:

void usub_borrow_invalid_borrow (NegativeTestContext& ctx)
{
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_uintTypes));
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_intTypes));

	ctx.beginSection("usubBorrow: Invalid borrow type.");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_floatTypes); ++dataTypeNdx)
			{
				{
					const std::string shaderSource(genShaderSourceAddCarrySubBorrow(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_USUB_BORROW, s_uintTypes[dataTypeNdx], s_uintTypes[dataTypeNdx], s_floatTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceAddCarrySubBorrow(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_USUB_BORROW, s_uintTypes[dataTypeNdx], s_uintTypes[dataTypeNdx], s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				for (int dataTypeNdx2 = 0; dataTypeNdx2 < DE_LENGTH_OF_ARRAY(s_floatTypes); ++dataTypeNdx2)
				{
					if (s_uintTypes[dataTypeNdx2] == s_uintTypes[dataTypeNdx])
						continue;

					const std::string shaderSource(genShaderSourceAddCarrySubBorrow(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_USUB_BORROW, s_uintTypes[dataTypeNdx], s_uintTypes[dataTypeNdx], s_uintTypes[dataTypeNdx2]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}